

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawImage.cpp
# Opt level: O0

void anon_unknown.dwarf_10b1::sp
               (Array2D<Imf_2_5::Rgba> *px,int w,int h,float xc,float yc,float rc,float rd,float gn,
               float bl,float lm)

{
  float *pfVar1;
  Rgba *pRVar2;
  int in_EDX;
  int in_ESI;
  Array2D<Imf_2_5::Rgba> *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM5_Da;
  Rgba *p;
  float db;
  float dg;
  float dr;
  float hl;
  float dl;
  float zl;
  float a;
  float r;
  float yl;
  float xl;
  int x;
  int y;
  int y2;
  int y1;
  int x2;
  int x1;
  undefined4 in_stack_ffffffffffffff70;
  float local_7c;
  int local_64;
  int local_60;
  float local_5c;
  float local_58;
  int local_54;
  float local_50;
  float local_4c;
  int local_48;
  float local_44;
  float local_40;
  int local_3c;
  float local_38;
  float local_34;
  int local_30;
  float local_28;
  float local_1c;
  float local_18;
  float local_14;
  int local_10;
  int local_c;
  Array2D<Imf_2_5::Rgba> *local_8;
  
  local_28 = in_XMM5_Da;
  local_1c = in_XMM2_Da;
  local_18 = in_XMM1_Da;
  local_14 = in_XMM0_Da;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  dVar6 = std::floor((double)(ulong)(uint)(in_XMM0_Da - in_XMM2_Da));
  local_34 = SUB84(dVar6,0);
  local_38 = 0.0;
  pfVar1 = std::max<float>(&local_34,&local_38);
  local_30 = (int)*pfVar1;
  dVar6 = std::ceil((double)(ulong)(uint)(local_14 + local_1c));
  local_40 = SUB84(dVar6,0);
  local_44 = (float)local_c - 1.0;
  pfVar1 = std::min<float>(&local_40,&local_44);
  local_3c = (int)*pfVar1;
  dVar6 = std::floor((double)(ulong)(uint)(local_18 - local_1c));
  local_4c = SUB84(dVar6,0);
  local_50 = 0.0;
  pfVar1 = std::max<float>(&local_4c,&local_50);
  local_48 = (int)*pfVar1;
  dVar6 = std::ceil((double)(ulong)(uint)(local_18 + local_1c));
  local_58 = SUB84(dVar6,0);
  local_5c = (float)local_10 - 1.0;
  pfVar1 = std::min<float>(&local_58,&local_5c);
  local_54 = (int)*pfVar1;
  for (local_60 = local_48; local_60 <= local_54; local_60 = local_60 + 1) {
    for (local_64 = local_30; local_64 <= local_3c; local_64 = local_64 + 1) {
      fVar3 = ((float)local_64 - local_14) / local_1c;
      fVar4 = ((float)local_60 - local_18) / local_1c;
      dVar6 = std::sqrt((double)(ulong)(uint)(fVar3 * fVar3 + fVar4 * fVar4));
      fVar5 = SUB84(dVar6,0);
      if (fVar5 < 1.0) {
        dVar6 = std::sqrt((double)(ulong)(uint)(-fVar5 * fVar5 + 1.0));
        local_7c = SUB84(dVar6,0) * 0.7071 + fVar3 * 0.42426 + -(fVar4 * 0.56568);
        if (local_7c < 0.0) {
          local_7c = local_7c * -0.1;
        }
        fVar3 = pw(local_7c,0x32);
        fVar3 = (local_7c + fVar3 * 4.0) * local_28;
        pRVar2 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](local_8,(long)local_60);
        pRVar2 = pRVar2 + local_64;
        half::operator_cast_to_float(&pRVar2->r);
        fVar4 = (float)((ulong)pRVar2 >> 0x20);
        half::operator=((half *)CONCAT44(fVar3,in_stack_ffffffffffffff70),fVar4);
        half::operator_cast_to_float(&pRVar2->g);
        half::operator=((half *)CONCAT44(fVar3,in_stack_ffffffffffffff70),fVar4);
        half::operator_cast_to_float(&pRVar2->b);
        half::operator=((half *)CONCAT44(fVar3,in_stack_ffffffffffffff70),fVar4);
        half::operator_cast_to_float(&pRVar2->a);
        half::operator=((half *)CONCAT44(fVar3,in_stack_ffffffffffffff70),fVar4);
      }
    }
  }
  return;
}

Assistant:

void
sp (Array2D<Rgba> &px, int w, int h,
    float xc, float yc, float rc,
    float rd, float gn, float bl, float lm)
{
    int x1 = int (max ((float) floor (xc - rc),  0.0f));
    int x2 = int (min ((float) ceil  (xc + rc), w - 1.0f));
    int y1 = int (max ((float) floor (yc - rc),  0.0f));
    int y2 = int (min ((float) ceil  (yc + rc), h - 1.0f));

    for (int y = y1; y <= y2; ++y)
    {
	for (int x = x1; x <= x2; ++x)
	{
	    float xl = (x - xc) / rc;
	    float yl = (y - yc) / rc;
	    float r  = sqrt (xl * xl + yl * yl);

	    if (r >= 1)
		continue;

	    float a = 1;

	    if (r * rc > rc - 1)
		a = rc - r * rc;

	    float zl = sqrt (1 - r * r);
	    float dl = xl * 0.42426 - yl * 0.56568 + zl * 0.70710;

	    if (dl < 0)
		dl *= -0.1;

	    float hl = pw (dl, 50) * 4;
	    float dr = (dl + hl) * rd;
	    float dg = (dl + hl) * gn;
	    float db = (dl + hl) * bl;

	    Rgba &p = px[y][x];
	    p.r = p.r * (1 - a) + dr * lm * a;
	    p.g = p.g * (1 - a) + dg * lm * a;
	    p.b = p.b * (1 - a) + db * lm * a;
	    p.a = 1 - (1 - p.a) * (1 - a);
	}
    }
}